

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitPow2(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
          *this,UnaryExpr e)

{
  BasicStringRef<char> value;
  
  Visit(this,(NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_ +
             8))->impl_,0xc);
  value.size_ = 4;
  value.data_ = " ^ 2";
  fmt::BasicWriter<char>::operator<<(this->writer_,value);
  return;
}

Assistant:

void VisitPow2(UnaryExpr e) {
    Visit(e.arg(), prec::EXPONENTIATION + 1);
    writer_ << " ^ 2";
  }